

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O1

Result __thiscall
presolve::HPresolve::equalityRowAddition<HighsTripletTreeSlicePreOrder>
          (HPresolve *this,HighsPostsolveStack *postsolve_stack,HighsInt stayrow,HighsInt removerow,
          double scale,HighsMatrixSlice<HighsTripletTreeSlicePreOrder> *rowvector)

{
  double dVar1;
  int iVar2;
  pointer pdVar3;
  pointer piVar4;
  uint uVar5;
  Result RVar6;
  pointer piVar7;
  double dVar8;
  double dVar9;
  HighsCDouble HVar10;
  vector<int,_std::allocator<int>_> stay_rowpositions;
  vector<int,_std::allocator<int>_> local_58;
  HighsCDouble local_40;
  
  local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (int *)0x0;
  local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (int *)0x0;
  local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  getRowPositions(this,stayrow,&local_58);
  HighsPostsolveStack::equalityRowAddition<HighsTripletTreeSlicePreOrder>
            (postsolve_stack,removerow,stayrow,scale,rowvector);
  piVar4 = local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  for (piVar7 = local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start; piVar7 != piVar4; piVar7 = piVar7 + 1) {
    iVar2 = *piVar7;
    uVar5 = findNonzero(this,removerow,
                        (this->Acol).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start[iVar2]);
    if (uVar5 == 0xffffffff) {
      addToMatrix(this,removerow,
                  (this->Acol).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[iVar2],
                  (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[iVar2] * scale);
    }
    else {
      unlink(this,(char *)(ulong)uVar5);
    }
  }
  pdVar3 = (this->model->row_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  dVar1 = pdVar3[removerow];
  if (dVar1 < INFINITY) {
    local_40.lo = 0.0;
    local_40.hi = scale;
    HVar10 = HighsCDouble::operator*(&local_40,pdVar3[stayrow]);
    dVar8 = HVar10.hi;
    dVar9 = dVar1 + dVar8;
    (this->model->row_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start[removerow] =
         HVar10.lo + (dVar1 - (dVar9 - dVar8)) + (dVar8 - (dVar9 - (dVar9 - dVar8))) + dVar9;
  }
  dVar1 = (this->model->row_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[removerow];
  if (-INFINITY < dVar1) {
    local_40.lo = 0.0;
    local_40.hi = scale;
    HVar10 = HighsCDouble::operator*
                       (&local_40,
                        (this->model->row_upper_).
                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[stayrow]);
    dVar8 = HVar10.hi;
    dVar9 = dVar1 + dVar8;
    (this->model->row_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start[removerow] =
         HVar10.lo + (dVar1 - (dVar9 - dVar8)) + (dVar8 - (dVar9 - (dVar9 - dVar8))) + dVar9;
  }
  RVar6 = rowPresolve(this,postsolve_stack,removerow);
  if (local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return RVar6;
}

Assistant:

HPresolve::Result HPresolve::equalityRowAddition(
    HighsPostsolveStack& postsolve_stack, HighsInt stayrow, HighsInt removerow,
    double scale, const HighsMatrixSlice<RowStorageFormat>& rowvector) {
  // extract non-zero positions
  std::vector<HighsInt> stay_rowpositions;
  getRowPositions(stayrow, stay_rowpositions);

  // update postsolve information
  postsolve_stack.equalityRowAddition(removerow, stayrow, scale, rowvector);

  // iterate over non-zero positions instead of iterating over the
  // HighsMatrixSlice because the latter contains pointers to Acol and Avalue
  // that may be invalidated if these vectors are reallocated
  // (see std::vector::push_back performed in HPresolve::addToMatrix).
  for (HighsInt rowiter : stay_rowpositions) {
    HighsInt pos = findNonzero(removerow, Acol[rowiter]);
    if (pos != -1)
      unlink(pos);  // all common nonzeros are cancelled, as the rows are
                    // parallel
    else            // might introduce a singleton
      addToMatrix(removerow, Acol[rowiter], scale * Avalue[rowiter]);
  }

  if (model->row_upper_[removerow] != kHighsInf)
    model->row_upper_[removerow] = static_cast<double>(
        model->row_upper_[removerow] +
        static_cast<HighsCDouble>(scale) * model->row_upper_[stayrow]);
  if (model->row_lower_[removerow] != -kHighsInf)
    model->row_lower_[removerow] = static_cast<double>(
        model->row_lower_[removerow] +
        static_cast<HighsCDouble>(scale) * model->row_upper_[stayrow]);

  // row is now a singleton row, doubleton equation, or a row
  // that contains only singletons and we let the normal row presolve
  // handle the cases
  HPRESOLVE_CHECKED_CALL(rowPresolve(postsolve_stack, removerow));
  return Result::kOk;
}